

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O2

bool SQCompilation::SQCompilationContext::loadConfigFile(char *configFile)

{
  bool bVar1;
  KeyValueFile config;
  KeyValueFile local_50;
  
  local_50.fileName._M_dataplus._M_p = (pointer)&local_50.fileName.field_2;
  local_50.printErrorFunc = (PrintErrorFunc)0x0;
  local_50.fileName._M_string_length = 0;
  local_50.fileName.field_2._M_local_buf[0] = '\0';
  local_50.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_50.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_50.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_50._60_8_ = 0;
  bVar1 = KeyValueFile::loadFromFile(&local_50,configFile);
  if (bVar1) {
    loadConfigFile(&local_50);
  }
  KeyValueFile::~KeyValueFile(&local_50);
  return bVar1;
}

Assistant:

bool SQCompilationContext::loadConfigFile(const char *configFile) {
  KeyValueFile config;
  if (!config.loadFromFile(configFile)) {
    return false;
  }

  return loadConfigFile(config);
}